

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  xmlHashTablePtr pxVar1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  undefined1 *puVar5;
  xmlChar *pxVar6;
  xmlChar felem [50];
  xmlChar axStack_68 [56];
  
  if (attr == (xmlAttrPtr)0x0) {
    return 0;
  }
  pxVar4 = attr->name;
  if (pxVar4 == (xmlChar *)0x0) {
    return 0;
  }
  if ((doc != (xmlDocPtr)0x0) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
    iVar3 = xmlStrEqual("id",pxVar4);
    if (iVar3 != 0) {
      return 1;
    }
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (elem->type != XML_ELEMENT_NODE) {
      return 0;
    }
    iVar3 = xmlStrEqual("name",attr->name);
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = xmlStrEqual(elem->name,"a");
    if (iVar3 == 0) {
      return 0;
    }
    return 1;
  }
  if (((attr->ns == (xmlNs *)0x0) || (pxVar6 = attr->ns->prefix, pxVar6 == (xmlChar *)0x0)) ||
     (iVar3 = strcmp((char *)pxVar4,"id"), iVar3 != 0)) {
    if (doc != (xmlDocPtr)0x0) goto LAB_00156904;
LAB_00156974:
    puVar5 = (undefined1 *)0x0;
  }
  else {
    iVar3 = strcmp((char *)pxVar6,"xml");
    puVar5 = (undefined1 *)(ulong)(iVar3 == 0);
    bVar2 = false;
    if ((doc == (xmlDocPtr)0x0) || (iVar3 == 0)) goto LAB_00156978;
LAB_00156904:
    if (doc->intSubset != (_xmlDtd *)0x0) {
      if (elem != (xmlNodePtr)0x0) {
LAB_00156925:
        puVar5 = (undefined1 *)0x0;
        bVar2 = false;
        if (elem->type != XML_ELEMENT_NODE) goto LAB_00156978;
        pxVar4 = elem->name;
        if (pxVar4 != (xmlChar *)0x0) {
          if ((elem->ns != (xmlNs *)0x0) && (pxVar6 = elem->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
            pxVar4 = xmlBuildQName(pxVar4,pxVar6,axStack_68,0x32);
          }
          if (pxVar4 == (xmlChar *)0x0) {
            puVar5 = (undefined1 *)0xffffffff;
          }
          else {
            if (attr->ns == (xmlNs *)0x0) {
              pxVar6 = (xmlChar *)0x0;
            }
            else {
              pxVar6 = attr->ns->prefix;
            }
            if ((doc->intSubset == (_xmlDtd *)0x0) ||
               (pxVar1 = (xmlHashTablePtr)doc->intSubset->attributes, pxVar1 == (xmlHashTablePtr)0x0
               )) {
              puVar5 = (undefined1 *)0x0;
            }
            else {
              puVar5 = (undefined1 *)xmlHashLookup3(pxVar1,attr->name,pxVar6,pxVar4);
            }
            if (puVar5 == (undefined1 *)0x0) {
              if ((doc->extSubset == (_xmlDtd *)0x0) ||
                 (pxVar1 = (xmlHashTablePtr)doc->extSubset->attributes,
                 pxVar1 == (xmlHashTablePtr)0x0)) {
                puVar5 = (undefined1 *)0x0;
              }
              else {
                puVar5 = (undefined1 *)xmlHashLookup3(pxVar1,attr->name,pxVar6,pxVar4);
              }
            }
            if ((pxVar4 != axStack_68) && (pxVar4 != elem->name)) {
              (*xmlFree)(pxVar4);
            }
            if ((puVar5 == (undefined1 *)0x0) || (*(int *)(puVar5 + 0x50) != 2)) {
              bVar2 = true;
              goto LAB_00156978;
            }
            puVar5 = &DAT_00000001;
          }
          goto LAB_00156976;
        }
      }
      goto LAB_00156974;
    }
    puVar5 = (undefined1 *)0x0;
    if (elem != (xmlNodePtr)0x0) {
      bVar2 = false;
      if (doc->extSubset == (_xmlDtd *)0x0) goto LAB_00156978;
      goto LAB_00156925;
    }
  }
LAB_00156976:
  bVar2 = false;
LAB_00156978:
  if (bVar2) {
    return 0;
  }
  return (int)puVar5;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL))
        return(0);

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        if (xmlStrEqual(BAD_CAST "id", attr->name))
            return(1);

        if ((elem == NULL) || (elem->type != XML_ELEMENT_NODE))
            return(0);

        if ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    (xmlStrEqual(elem->name, BAD_CAST "a")))
	    return(1);
    } else {
	xmlAttributePtr attrDecl = NULL;
	xmlChar felem[50];
	xmlChar *fullelemname;
        const xmlChar *aprefix;

        if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
            (!strcmp((char *) attr->name, "id")) &&
            (!strcmp((char *) attr->ns->prefix, "xml")))
            return(1);

        if ((doc == NULL) ||
            ((doc->intSubset == NULL) && (doc->extSubset == NULL)))
            return(0);

        if ((elem == NULL) ||
            (elem->type != XML_ELEMENT_NODE) ||
            (elem->name == NULL))
            return(0);

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;
        if (fullelemname == NULL)
            return(-1);

        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

	if (fullelemname != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullelemname,
		                          attr->name, aprefix);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullelemname,
					      attr->name, aprefix);
	}

	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }

    return(0);
}